

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

int __thiscall Fossilize::FeatureFilter::Impl::init(Impl *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  int iVar2;
  undefined8 extraout_RAX;
  uint in_ECX;
  long in_RDX;
  VkPhysicalDeviceProperties2 *in_R8;
  void *in_R9;
  allocator local_61;
  string local_60 [36];
  uint local_3c;
  void *pvStack_38;
  uint i;
  VkPhysicalDeviceProperties2 *properties_local;
  VkPhysicalDeviceFeatures2 *enabled_features_local;
  long lStack_20;
  uint count_local;
  char **device_exts_local;
  Impl *pIStack_10;
  uint32_t api_version__local;
  Impl *this_local;
  
  device_exts_local._4_4_ = (uint32_t)ctx;
  pvStack_38 = in_R9;
  properties_local = in_R8;
  enabled_features_local._4_4_ = in_ECX;
  lStack_20 = in_RDX;
  pIStack_10 = this;
  for (local_3c = 0; local_3c < enabled_features_local._4_4_; local_3c = local_3c + 1) {
    pcVar1 = *(char **)(lStack_20 + (ulong)local_3c * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar1,&local_61);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->enabled_extensions,(value_type *)local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    iVar2 = strcmp(*(char **)(lStack_20 + (ulong)local_3c * 8),"VK_EXT_scalar_block_layout");
    if (iVar2 == 0) {
      (this->features).vk12.scalarBlockLayout = 1;
    }
  }
  this->api_version = device_exts_local._4_4_;
  memcpy(&this->props2,pvStack_38,0x348);
  memcpy(&this->features2,properties_local,0xf0);
  init_features(this,properties_local->pNext);
  init_properties(this,*(void **)((long)pvStack_38 + 8));
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool FeatureFilter::Impl::init(uint32_t api_version_, const char **device_exts, unsigned count,
                               const VkPhysicalDeviceFeatures2 *enabled_features,
                               const VkPhysicalDeviceProperties2 *properties)
{
	for (unsigned i = 0; i < count; i++)
	{
		enabled_extensions.insert(device_exts[i]);
		if (strcmp(device_exts[i], VK_EXT_SCALAR_BLOCK_LAYOUT_EXTENSION_NAME) == 0)
			features.vk12.scalarBlockLayout = VK_TRUE;
	}

	api_version = api_version_;
	props2 = *properties;
	features2 = *enabled_features;

	init_features(enabled_features->pNext);
	init_properties(properties->pNext);

	return true;
}